

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_info.cc
# Opt level: O2

void __thiscall absl::lts_20240722::cord_internal::CordzInfo::Untrack(CordzInfo *this)

{
  RefcountAndFlags *pRVar1;
  CordzInfo *pCVar2;
  __pointer_type pCVar3;
  __pointer_type pCVar4;
  char cVar5;
  atomic<absl::lts_20240722::cord_internal::CordzInfo_*> *paVar6;
  SpinLockHolder l;
  SpinLockHolder local_10;
  
  ODRCheck(this);
  local_10.lock_ = &this->list_->mutex;
  base_internal::SpinLock::Lock(local_10.lock_);
  pCVar2 = (this->list_->head)._M_b._M_p;
  pCVar3 = (this->ci_next_)._M_b._M_p;
  pCVar4 = (this->ci_prev_)._M_b._M_p;
  if (pCVar3 != (__pointer_type)0x0) {
    if ((pCVar3->ci_prev_)._M_b._M_p != this) {
      __assert_fail("false && \"next->ci_prev_.load(std::memory_order_acquire) == this\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/strings/internal/cordz_info.cc"
                    ,0x162,
                    "auto absl::cord_internal::CordzInfo::Untrack()::(anonymous class)::operator()() const"
                   );
    }
    (pCVar3->ci_prev_)._M_b._M_p = pCVar4;
  }
  if (pCVar4 == (__pointer_type)0x0) {
    if (pCVar2 != this) {
      __assert_fail("false && \"head == this\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/strings/internal/cordz_info.cc"
                    ,0x16a,
                    "auto absl::cord_internal::CordzInfo::Untrack()::(anonymous class)::operator()() const"
                   );
    }
    paVar6 = &this->list_->head;
  }
  else {
    if (pCVar2 == this) {
      __assert_fail("false && \"head != this\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/strings/internal/cordz_info.cc"
                    ,0x166,
                    "auto absl::cord_internal::CordzInfo::Untrack()::(anonymous class)::operator()() const"
                   );
    }
    if ((pCVar4->ci_next_)._M_b._M_p != this) {
      __assert_fail("false && \"prev->ci_next_.load(std::memory_order_acquire) == this\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/strings/internal/cordz_info.cc"
                    ,0x167,
                    "auto absl::cord_internal::CordzInfo::Untrack()::(anonymous class)::operator()() const"
                   );
    }
    paVar6 = &pCVar4->ci_next_;
  }
  (paVar6->_M_b)._M_p = pCVar3;
  base_internal::SpinLockHolder::~SpinLockHolder(&local_10);
  cVar5 = absl::lts_20240722::cord_internal::CordzHandle::SafeToDelete();
  if (cVar5 == '\0') {
    local_10.lock_ = (SpinLock *)&this->mutex_;
    absl::lts_20240722::Mutex::Lock();
    if (this->rep_ != (CordRep *)0x0) {
      LOCK();
      pRVar1 = &this->rep_->refcount;
      (pRVar1->count_).super___atomic_base<int>._M_i =
           (pRVar1->count_).super___atomic_base<int>._M_i + 2;
      UNLOCK();
    }
    MutexLock::~MutexLock((MutexLock *)&local_10);
    absl::lts_20240722::cord_internal::CordzHandle::Delete(&this->super_CordzHandle);
  }
  else {
    this->rep_ = (CordRep *)0x0;
    (**(code **)(*(long *)this + 8))(this);
  }
  return;
}

Assistant:

void CordzInfo::Untrack() {
  ODRCheck();
  {
    SpinLockHolder l(&list_->mutex);

    CordzInfo* const head = list_->head.load(std::memory_order_acquire);
    CordzInfo* const next = ci_next_.load(std::memory_order_acquire);
    CordzInfo* const prev = ci_prev_.load(std::memory_order_acquire);

    if (next) {
      ABSL_ASSERT(next->ci_prev_.load(std::memory_order_acquire) == this);
      next->ci_prev_.store(prev, std::memory_order_release);
    }
    if (prev) {
      ABSL_ASSERT(head != this);
      ABSL_ASSERT(prev->ci_next_.load(std::memory_order_acquire) == this);
      prev->ci_next_.store(next, std::memory_order_release);
    } else {
      ABSL_ASSERT(head == this);
      list_->head.store(next, std::memory_order_release);
    }
  }

  // We can no longer be discovered: perform a fast path check if we are not
  // listed on any delete queue, so we can directly delete this instance.
  if (SafeToDelete()) {
    UnsafeSetCordRep(nullptr);
    delete this;
    return;
  }

  // We are likely part of a snapshot, extend the life of the CordRep
  {
    absl::MutexLock lock(&mutex_);
    if (rep_) CordRep::Ref(rep_);
  }
  CordzHandle::Delete(this);
}